

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execShiftEa<(moira::Instr)13,(moira::Mode)2,(moira::Size)2>(Moira *this,u16 op)

{
  bool bVar1;
  u32 uVar2;
  ulong in_RAX;
  u32 data;
  u32 ea;
  undefined8 local_18;
  
  local_18 = in_RAX;
  bVar1 = readOp<(moira::Mode)2,(moira::Size)2,0ul>
                    (this,op & 7,(u32 *)((long)&local_18 + 4),(u32 *)&local_18);
  if (bVar1) {
    uVar2 = (this->reg).pc;
    (this->reg).pc0 = uVar2;
    (this->queue).ird = (this->queue).irc;
    uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar2;
    uVar2 = shift<(moira::Instr)13,(moira::Size)2>(this,1,local_18 & 0xffffffff);
    writeM<(moira::MemSpace)1,(moira::Size)2,4ul>(this,local_18._4_4_,uVar2);
  }
  return;
}

Assistant:

void
Moira::execShiftEa(u16 op)
{
    int src = _____________xxx(op);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    prefetch();

    writeM<M,S, POLLIPL>(ea, shift<I,S>(1, data));
}